

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zipx_zstd_init(archive_read *a,zip *zip)

{
  uint uVar1;
  ZSTD_DStream *pZVar2;
  size_t sVar3;
  char *pcVar4;
  uchar *puVar5;
  size_t r;
  zip *zip_local;
  archive_read *a_local;
  
  if (zip->zstdstream_valid != '\0') {
    ZSTD_freeDStream(zip->zstdstream);
    zip->zstdstream_valid = '\0';
  }
  pZVar2 = ZSTD_createDStream();
  zip->zstdstream = pZVar2;
  sVar3 = ZSTD_initDStream(zip->zstdstream);
  uVar1 = ZSTD_isError(sVar3);
  if (uVar1 == 0) {
    zip->zstdstream_valid = '\x01';
    free(zip->uncompressed_buffer);
    sVar3 = ZSTD_DStreamOutSize();
    zip->uncompressed_buffer_size = sVar3;
    puVar5 = (uchar *)malloc(zip->uncompressed_buffer_size);
    zip->uncompressed_buffer = puVar5;
    if (zip->uncompressed_buffer == (uchar *)0x0) {
      archive_set_error(&a->archive,0xc,"No memory for Zstd decompression");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      zip->decompress_init = '\x01';
      a_local._4_4_ = L'\0';
    }
  }
  else {
    pcVar4 = ZSTD_getErrorName(sVar3);
    archive_set_error(&a->archive,-1,"Error initializing zstd decompressor: %s",pcVar4);
    a_local._4_4_ = L'\xffffffe7';
  }
  return a_local._4_4_;
}

Assistant:

static int
zipx_zstd_init(struct archive_read *a, struct zip *zip)
{
	size_t r;

	/* Deallocate already existing Zstd decompression context if it
	 * exists. */
	if(zip->zstdstream_valid) {
		ZSTD_freeDStream(zip->zstdstream);
		zip->zstdstream_valid = 0;
	}

	/* Allocate a new Zstd decompression context. */
	zip->zstdstream = ZSTD_createDStream();

	r = ZSTD_initDStream(zip->zstdstream);
	if (ZSTD_isError(r)) {
		 archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			"Error initializing zstd decompressor: %s",
			ZSTD_getErrorName(r));

		return ARCHIVE_FAILED;
	}

	/* Mark the zstdstream field to be released in cleanup phase. */
	zip->zstdstream_valid = 1;

	/* (Re)allocate the buffer that will contain decompressed bytes. */
	free(zip->uncompressed_buffer);

	zip->uncompressed_buffer_size = ZSTD_DStreamOutSize();
	zip->uncompressed_buffer =
	    (uint8_t*) malloc(zip->uncompressed_buffer_size);
	if (zip->uncompressed_buffer == NULL) {
		archive_set_error(&a->archive, ENOMEM,
			"No memory for Zstd decompression");

		return ARCHIVE_FATAL;
	}

	/* Initialization done. */
	zip->decompress_init = 1;
	return ARCHIVE_OK;
}